

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::Test::RecordProperty(string *key,int value)

{
  char *__s;
  long in_FS_OFFSET;
  string *key_local;
  Message local_60;
  Message value_message;
  undefined1 local_50 [4];
  int value_local;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  value_message.ss_.ptr_._4_4_ = value;
  Message::Message(&local_60);
  Message::operator<<(&local_60,(int *)((long)&value_message.ss_.ptr_ + 4));
  Message::GetString_abi_cxx11_((string *)local_50,&local_60);
  __s = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,__s,(allocator<char> *)((long)&key_local + 7));
  RecordProperty(key,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)((long)&key_local + 7));
  std::__cxx11::string::~string((string *)local_50);
  Message::~Message(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Test::RecordProperty(const std::string& key, int value) {
  Message value_message;
  value_message << value;
  RecordProperty(key, value_message.GetString().c_str());
}